

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic.cpp
# Opt level: O2

void __thiscall SemanticTypes::visit(SemanticTypes *this,CallNode *callNode)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  TokenNode *pTVar5;
  ExpListNode *pEVar6;
  FormalListNode *pFVar7;
  PointerNode *pPVar8;
  ExpNode *pEVar9;
  ArrayNode *pAVar10;
  int iVar11;
  FunctionSymbol *pFVar12;
  char *pcVar13;
  ulong uVar14;
  char *__format;
  ExpListNode **ppEVar15;
  FormalListNode **ppFVar16;
  bool bVar17;
  
  pTVar5 = callNode->id;
  if (pTVar5 == (TokenNode *)0x0) {
    fprintf(_stderr,"[SEMANTIC ERROR - callNode] INVALID FUNCTION CALL, line %d\n",
            (ulong)(uint)(callNode->super_ExpNode).super_StmtNode.super_ASTNode.line);
    return;
  }
  (*(pTVar5->super_ExpNode).super_StmtNode.super_ASTNode._vptr_ASTNode[3])(pTVar5,this);
  pEVar6 = callNode->parameters;
  if (pEVar6 != (ExpListNode *)0x0) {
    (*(pEVar6->super_ASTNode)._vptr_ASTNode[3])(pEVar6,this);
  }
  pFVar12 = FunctionTable::cSearch(functionTable,(callNode->id->super_ExpNode).lexeme);
  if (pFVar12 == (FunctionSymbol *)0x0) {
    uVar14 = (ulong)(uint)(callNode->super_ExpNode).super_StmtNode.super_ASTNode.line;
    pcVar13 = (callNode->id->super_ExpNode).lexeme;
    __format = "[SEMANTIC ERROR - callNode] CALL TO UNDEFINED FUNCTION, line: %d lexeme: %s\n";
  }
  else {
    ppEVar15 = &callNode->parameters;
    ppFVar16 = &pFVar12->varDecl;
    while( true ) {
      pFVar7 = *ppFVar16;
      pEVar6 = *ppEVar15;
      if ((pFVar7 == (FormalListNode *)0x0) || (pEVar6 == (ExpListNode *)0x0)) break;
      (*(pEVar6->super_ASTNode)._vptr_ASTNode[3])(pEVar6,this);
      pPVar8 = pFVar7->pointer;
      pTVar5 = pFVar7->type->id;
      iVar2 = pTVar5->token;
      pEVar9 = pEVar6->exp;
      iVar3 = pEVar9->type;
      pAVar10 = pFVar7->array;
      iVar4 = pEVar9->arraySize;
      bVar1 = pEVar9->pointer;
      if (iVar2 == 10) {
        iVar11 = strcmp((pTVar5->super_ExpNode).typeLexeme,pEVar9->typeLexeme);
        bVar17 = iVar11 != 0;
      }
      else {
        bVar17 = false;
      }
      if ((((iVar2 != iVar3) || ((pAVar10 != (ArrayNode *)0x0) != 0 < iVar4)) ||
          ((pPVar8 != (PointerNode *)0x0) != bVar1)) || (bVar17)) {
        uVar14 = (ulong)(uint)(pEVar6->super_ASTNode).line;
        pcVar13 = (pFVar7->id->super_ExpNode).lexeme;
        __format = "[SEMANTIC ERROR - callNode] PARAMETER TYPE MISMATCH, line: %d parameter: %s\n";
        goto LAB_0010fcc4;
      }
      ppEVar15 = &pEVar6->next;
      ppFVar16 = &pFVar7->next;
    }
    if (pFVar7 == (FormalListNode *)0x0 && pEVar6 == (ExpListNode *)0x0) {
      if ((activeFunction != (FunctionSymbol *)0x0) &&
         (activeFunction->callSize < pFVar12->paramSize)) {
        activeFunction->callSize = pFVar12->paramSize;
      }
      (callNode->super_ExpNode).lexeme = (callNode->id->super_ExpNode).lexeme;
      pTVar5 = pFVar12->returnType->id;
      (callNode->super_ExpNode).type = pTVar5->token;
      (callNode->super_ExpNode).typeLexeme = (pTVar5->super_ExpNode).typeLexeme;
      (callNode->super_ExpNode).pointer = pFVar12->pointer;
      (callNode->super_ExpNode).arraySize = -1;
      (callNode->super_ExpNode).lValue = false;
      return;
    }
    uVar14 = (ulong)(uint)(callNode->super_ExpNode).super_StmtNode.super_ASTNode.line;
    pcVar13 = (callNode->id->super_ExpNode).lexeme;
    __format = "[SEMANTIC ERROR - callNode] PARAMETER COUNT MISMATCH, line: %d lexeme: %s\n";
  }
LAB_0010fcc4:
  fprintf(_stderr,__format,uVar14,pcVar13);
  return;
}

Assistant:

void SemanticTypes::visit(CallNode *callNode) {

    if (callNode->getId()) {
        callNode->getId()->accept(this);
    } else {
        fprintf(stderr, "[SEMANTIC ERROR - callNode] INVALID FUNCTION CALL, line %d\n", callNode->getLine());
        return;
    }

    if (callNode->getParameters()) {
        callNode->getParameters()->accept(this);
    }

    FunctionSymbol *func = functionTable->cSearch(callNode->getId()->getLexeme());

    if (!func) {
        fprintf(stderr, "[SEMANTIC ERROR - callNode] CALL TO UNDEFINED FUNCTION, line: %d lexeme: %s\n",
                callNode->getLine(), callNode->getId()->getLexeme());
        return;
    }

    FormalListNode *expectedParameter = func->getVarDecl();
    ExpListNode *parameter = callNode->getParameters();

    while (expectedParameter && parameter) {

        parameter->accept(this);

        bool isSameType = expectedParameter->getParameterType() == parameter->getExp()->getType();
        bool isSameArray = (expectedParameter->getArray() != NULL) == (parameter->getExp()->getArraySize() > 0);
        bool isSamePointer = (expectedParameter->getPointer() != NULL) == parameter->getExp()->isPointer();
        bool isSameTypeLexeme = true;

        if (expectedParameter->getParameterType() == ID)
            isSameTypeLexeme = !strcmp(expectedParameter->getParameterTypeLexeme(),
                                       parameter->getExp()->getTypeLexeme());

        if (!(isSameArray && isSamePointer && isSameType && isSameTypeLexeme)) {
            fprintf(stderr, "[SEMANTIC ERROR - callNode] PARAMETER TYPE MISMATCH, line: %d parameter: %s\n",
                    parameter->getLine(), expectedParameter->getId()->getLexeme());
            return;
        }

        parameter = parameter->getNext();
        expectedParameter = expectedParameter->getNext();
    }

    if (expectedParameter || parameter) {
        fprintf(stderr, "[SEMANTIC ERROR - callNode] PARAMETER COUNT MISMATCH, line: %d lexeme: %s\n",
                callNode->getLine(), callNode->getId()->getLexeme());
        return;
    }

    //Inform the caller the needed params size
    if(activeFunction) {
        activeFunction->setCallSize(func->getParamSize());
    }

    callNode->setLexeme(callNode->getId()->getLexeme());
    callNode->setType(func->getReturnType()->getType());
    callNode->setTypeLexeme(func->getReturnType()->getTypeLexeme());
    callNode->setPointer(func->isPointer());
    callNode->setArraySize(-1);
    callNode->setLValue(false);
}